

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

void __thiscall
duckdb::TemporaryFileHandle::WriteTemporaryBuffer
          (TemporaryFileHandle *this,FileBuffer *buffer,idx_t block_index,
          AllocatedData *compressed_buffer)

{
  TemporaryBufferSize nr_bytes;
  type handle;
  pointer this_00;
  
  if ((this->identifier).size == DEFAULT) {
    handle = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator*(&this->handle);
    FileBuffer::Write(buffer,handle,block_index * (this->identifier).size);
    return;
  }
  this_00 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
            operator->(&this->handle);
  nr_bytes = (this->identifier).size;
  FileHandle::Write(this_00,compressed_buffer->pointer,nr_bytes,block_index * nr_bytes);
  return;
}

Assistant:

void TemporaryFileHandle::WriteTemporaryBuffer(FileBuffer &buffer, const idx_t block_index,
                                               AllocatedData &compressed_buffer) const {
	// We group DEFAULT_BLOCK_ALLOC_SIZE blocks into the same file.
	D_ASSERT(buffer.AllocSize() == BufferManager::GetBufferManager(db).GetBlockAllocSize());
	if (identifier.size == TemporaryBufferSize::DEFAULT) {
		buffer.Write(*handle, GetPositionInFile(block_index));
	} else {
		handle->Write(compressed_buffer.get(), TemporaryBufferSizeToSize(identifier.size),
		              GetPositionInFile(block_index));
	}
}